

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_flash_attn_ext
               (ggml_compute_params *params,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,
               ggml_tensor *mask,ggml_tensor *dst)

{
  float *pfVar1;
  undefined2 *puVar2;
  float fVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  ggml_from_float_t p_Var9;
  void *pvVar10;
  uint uVar11;
  ggml_tensor *pgVar12;
  int i_1;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  ggml_type_traits_cpu *pgVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  size_t __n;
  long lVar24;
  undefined8 uVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  float *pfVar29;
  ushort *puVar30;
  ulong uVar31;
  int iVar32;
  int64_t iVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar41 [48];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_02 [56];
  undefined1 auVar45 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_03 [56];
  undefined1 auVar48 [64];
  undefined1 in_ZMM5 [64];
  int local_250;
  int local_248;
  int local_238;
  void *local_230;
  float local_204;
  float *local_200;
  int64_t local_1f8;
  long local_1f0;
  int64_t local_1e8;
  float *local_1e0;
  ulong local_1d8;
  uint local_1cc;
  undefined1 local_1c8 [16];
  size_t local_1b8;
  ggml_tensor *local_1b0;
  size_t local_1a8;
  ggml_compute_params *local_1a0;
  size_t local_198;
  long local_190;
  ggml_tensor *local_188;
  size_t local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  long local_150;
  long local_148;
  ggml_from_float_t local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  int64_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  ggml_tensor *local_d0;
  ggml_tensor *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  code *local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ggml_vec_dot_t local_80;
  size_t local_78;
  long local_70;
  undefined1 local_68 [16];
  float local_58;
  float local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar44 = local_1c8;
  auVar41 = in_ZmmResult._16_48_;
  local_1a0 = params;
  if (1 < (uint)dst->op_params[3]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1bb5,"fatal error");
  }
  uVar6 = v->ne[0];
  if (dst->ne[0] == uVar6) {
    local_1f0 = q->ne[1];
    local_c8 = mask;
    if (dst->ne[2] == local_1f0) {
      lVar19 = q->ne[2];
      local_d8 = q->nb[1];
      sVar17 = k->nb[0];
      local_1e8 = q->ne[0];
      lVar26 = q->ne[3];
      sVar16 = q->nb[0];
      uVar31 = dst->nb[2];
      local_e0 = q->nb[2];
      local_e8 = q->nb[3];
      local_108 = v->nb[3];
      lVar20 = k->ne[0];
      local_1e0 = (float *)k->ne[1];
      local_1f8 = k->ne[2];
      lVar21 = k->ne[3];
      local_78 = k->nb[1];
      local_f0 = k->nb[2];
      local_f8 = k->nb[3];
      sVar7 = v->nb[0];
      local_1d8 = v->ne[3];
      lVar24 = v->ne[2];
      local_100 = v->nb[2];
      local_180 = v->nb[1];
      local_110 = dst->ne[1];
      sVar8 = dst->nb[0];
      local_1a8 = dst->nb[1];
      uVar34 = dst->nb[3];
      local_1c8._4_4_ = 0;
      local_1c8._0_4_ = params->nth;
      iVar5 = params->ith;
      local_1c8._8_8_ = auVar44._8_8_;
      local_1b0 = dst;
      local_d0 = q;
      sVar15 = ggml_type_size(q->type);
      if (sVar16 == sVar15) {
        local_188 = k;
        sVar16 = ggml_type_size(k->type);
        if (sVar17 == sVar16) {
          sVar17 = ggml_type_size(v->type);
          auVar48._8_56_ = extraout_var_03;
          auVar48._0_8_ = extraout_XMM1_Qa;
          auVar44 = auVar48._0_16_;
          if (sVar7 == sVar17) {
            if (local_1e8 == lVar20) {
              if (sVar8 == 4) {
                if (local_1a8 < 4) {
                  pcVar23 = "nb0 <= nb1";
                  uVar25 = 0x1af2;
                }
                else if (uVar31 < local_1a8) {
                  pcVar23 = "nb1 <= nb2";
                  uVar25 = 0x1af3;
                }
                else if (uVar34 < uVar31) {
                  pcVar23 = "nb2 <= nb3";
                  uVar25 = 0x1af4;
                }
                else {
                  local_118 = lVar19 / local_1f8;
                  local_120 = lVar26 / lVar21;
                  local_128 = lVar19 / lVar24;
                  local_130 = lVar26 / (long)local_1d8;
                  local_138 = lVar19 * local_1f0;
                  iVar28 = (int)lVar26 * (int)local_138;
                  iVar13 = (iVar28 + -1 + local_1c8._0_4_) / local_1c8._0_4_;
                  local_168 = ZEXT416((uint)local_1b0->op_params[0]);
                  iVar32 = iVar13 * iVar5;
                  iVar13 = iVar13 + iVar32;
                  if (iVar28 <= iVar13) {
                    iVar13 = iVar28;
                  }
                  local_178 = ZEXT416((uint)local_1b0->op_params[1]);
                  fVar3 = (float)local_1b0->op_params[2];
                  auVar38._0_8_ = std::log2<unsigned_int>((uint)lVar19);
                  auVar38._8_56_ = extraout_var_02;
                  auVar36 = vroundsd_avx(auVar38._0_16_,auVar38._0_16_,9);
                  uVar14 = vcvttsd2usi_avx512f(auVar36);
                  local_1cc = 1 << (uVar14 & 0x1f);
                  auVar36._8_4_ = 0x80000000;
                  auVar36._0_8_ = 0x8000000080000000;
                  auVar36._12_4_ = 0x80000000;
                  auVar36 = vxorps_avx512vl(local_178,auVar36);
                  auVar44 = vcvtusi2ss_avx512f(auVar44,local_1cc);
                  local_48 = exp2f(auVar36._0_4_ / auVar44._0_4_);
                  local_58 = exp2f(((float)local_178._0_4_ * -0.5) / auVar44._0_4_);
                  pgVar12 = local_188;
                  pgVar18 = ggml_get_type_traits_cpu(local_188->type);
                  pgVar18 = ggml_get_type_traits_cpu(pgVar18->vec_dot_type);
                  p_Var9 = pgVar18->from_float;
                  pgVar18 = ggml_get_type_traits_cpu(pgVar12->type);
                  local_80 = pgVar18->vec_dot;
                  lVar19 = ggml_get_type_traits(v->type);
                  local_140 = p_Var9;
                  if (p_Var9 == (ggml_from_float_t)0x0) {
                    pcVar23 = "( q_to_vec_dot) && \"fattn: unsupported K-type\"";
                    uVar25 = 0x1b20;
                  }
                  else {
                    local_a0 = *(code **)(lVar19 + 0x28);
                    if (local_a0 != (code *)0x0 || v->type == GGML_TYPE_F32) {
                      local_198 = uVar6 * 2;
                      local_1b8 = uVar6 * 4;
                      iVar28 = (int)uVar6;
                      uVar31 = (ulong)iVar28;
                      uVar25 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT816(0) << 0x40,4);
                      bVar35 = (bool)((byte)uVar25 & 1);
                      uVar34 = uVar31 & 0xffffffffffffffc0;
                      local_1d8 = ~((long)local_1e0 >> 0x3f) & (ulong)local_1e0;
                      local_a8 = (long)iVar32;
                      local_148 = (local_1e8 + 0x10 + uVar6 * 2) * (long)iVar5 * 4;
                      local_88 = ~((long)uVar6 >> 0x3f) & uVar6;
                      local_c0 = (long)iVar13;
                      local_150 = (uVar31 >> 6) << 7;
                      auVar40._16_48_ = auVar41;
                      auVar40._0_16_ = local_168;
                      auVar39._4_60_ = auVar40._4_60_;
                      auVar39._0_4_ =
                           (uint)bVar35 * (int)(local_168._0_4_ / fVar3) +
                           (uint)!bVar35 * (int)local_168._0_4_;
                      local_168 = auVar39._0_16_;
                      iVar33 = local_1e8;
                      do {
                        if (local_c0 <= local_a8) {
                          return;
                        }
                        local_190 = (long)(int)(local_a8 / local_138);
                        lVar26 = local_a8 - local_190 * local_138;
                        lVar19 = lVar26 % local_1f0;
                        local_1f8 = CONCAT44(local_1f8._4_4_,0x3f800000);
                        uVar14 = (uint)(lVar26 / local_1f0);
                        if (0.0 < (float)local_178._0_4_) {
                          bVar35 = uVar14 < local_1cc;
                          uVar11 = (uVar14 - local_1cc) * 2;
                          if (bVar35) {
                            uVar11 = uVar14;
                          }
                          auVar44 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar11 + 1);
                          fVar42 = powf((float)((uint)bVar35 * (int)local_48 +
                                               (uint)!bVar35 * (int)local_58),auVar44._0_4_);
                          local_1f8 = CONCAT44(local_1f8._4_4_,fVar42);
                        }
                        local_200 = (float *)((long)local_1a0->wdata + local_148);
                        pfVar1 = local_200 + uVar6;
                        __n = local_1b8;
                        pfVar29 = local_200;
                        if (v->type == GGML_TYPE_F16) {
                          __n = local_198;
                          pfVar29 = pfVar1;
                        }
                        memset(pfVar29,0,__n);
                        local_250 = (int)lVar19;
                        if (local_c8 == (ggml_tensor *)0x0) {
                          local_230 = (void *)0x0;
                        }
                        else {
                          local_230 = (void *)(local_c8->nb[1] * (long)local_250 +
                                              (long)local_c8->data);
                        }
                        local_b0 = (long)local_250;
                        local_b8 = (long)(int)uVar14;
                        lVar19 = local_190 / local_120;
                        lVar26 = local_b8 / local_118;
                        lVar20 = local_190 / local_130;
                        lVar21 = local_b8 / local_128;
                        local_1e0 = local_200 + local_198;
                        (*local_140)((float *)((long)local_d0->data +
                                              local_b8 * local_e0 +
                                              local_190 * local_e8 + local_b0 * local_d8),local_1e0,
                                     iVar33);
                        local_250 = (int)lVar19;
                        local_238 = (int)lVar20;
                        auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar27 = 0;
                        local_98 = (long)local_238 * local_108;
                        local_70 = (long)local_250 * local_f8 + (long)(int)lVar26 * local_f0;
                        fVar42 = -INFINITY;
                        local_248 = (int)lVar21;
                        local_90 = (long)local_248 * local_100;
                        lVar19 = local_98 + local_90;
                        lVar26 = local_150 + local_98 + local_90;
                        while( true ) {
                          pfVar29 = local_200;
                          if (uVar27 == local_1d8) break;
                          if (local_230 == (void *)0x0) {
                            fVar43 = 0.0;
LAB_00140c50:
                            local_1c8._0_4_ = fVar43;
                            (*local_80)((int)iVar33,&local_204,0,
                                        (void *)((long)local_188->data +
                                                local_70 + uVar27 * local_78),0,local_1e0,0,1);
                            fVar43 = (float)local_168._0_4_ * local_204;
                            if ((fVar3 != 0.0) || (NAN(fVar3))) {
                              fVar43 = tanhf(fVar43);
                              fVar43 = fVar43 * fVar3;
                            }
                            fVar43 = fVar43 + (float)local_1c8._0_4_;
                            pvVar10 = v->data;
                            local_204 = fVar43;
                            if (v->type == GGML_TYPE_F16) {
                              if (fVar43 <= fVar42) {
                                auVar46._0_4_ = expf(fVar43 - fVar42);
                                auVar46._4_60_ = extraout_var_00;
                                auVar44 = SUB6416(ZEXT464(0x3f800000),0);
                                in_ZMM5 = ZEXT1664(auVar46._0_16_);
                              }
                              else {
                                auVar45._0_4_ = expf(fVar42 - fVar43);
                                auVar45._4_60_ = extraout_var;
                                auVar44 = auVar45._0_16_;
                                auVar38 = vbroadcastss_avx512f(auVar44);
                                pfVar29 = pfVar1;
                                for (lVar20 = 0; uVar22 = uVar34, lVar20 < (long)uVar34;
                                    lVar20 = lVar20 + 0x40) {
                                  for (lVar21 = 0; lVar21 != 0x80; lVar21 = lVar21 + 0x20) {
                                    auVar39 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                 ((long)pfVar29 + lVar21));
                                    auVar39 = vmulps_avx512f(auVar38,auVar39);
                                    puVar2 = (undefined2 *)((long)pfVar29 + lVar21);
                                    auVar37 = vcvtps2ph_avx512f(auVar39,0);
                                    *puVar2 = auVar37._0_2_;
                                    puVar2[1] = auVar37._2_2_;
                                    puVar2[2] = auVar37._4_2_;
                                    puVar2[3] = auVar37._6_2_;
                                    puVar2[4] = auVar37._8_2_;
                                    puVar2[5] = auVar37._10_2_;
                                    puVar2[6] = auVar37._12_2_;
                                    puVar2[7] = auVar37._14_2_;
                                    puVar2[8] = auVar37._16_2_;
                                    puVar2[9] = auVar37._18_2_;
                                    puVar2[10] = auVar37._20_2_;
                                    puVar2[0xb] = auVar37._22_2_;
                                    puVar2[0xc] = auVar37._24_2_;
                                    puVar2[0xd] = auVar37._26_2_;
                                    puVar2[0xe] = auVar37._28_2_;
                                    puVar2[0xf] = auVar37._30_2_;
                                  }
                                  pfVar29 = pfVar29 + 0x20;
                                }
                                for (; (long)uVar22 < (long)uVar31; uVar22 = uVar22 + 1) {
                                  auVar36 = vcvtps2ph_f16c(ZEXT416((uint)(auVar45._0_4_ *
                                                                         *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pfVar1 + uVar22 * 2) * 4)
                                                  )),0);
                                  vpextrw_avx(auVar36,0);
                                }
                                in_ZMM5 = ZEXT464(0x3f800000);
                                fVar42 = fVar43;
                              }
                              auVar38 = vbroadcastss_avx512f(in_ZMM5._0_16_);
                              lVar20 = lVar19 + (long)pvVar10;
                              pfVar29 = pfVar1;
                              for (lVar21 = 0; lVar21 < (long)uVar34; lVar21 = lVar21 + 0x40) {
                                for (lVar24 = 0; lVar24 != 0x80; lVar24 = lVar24 + 0x20) {
                                  auVar39 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                               (lVar20 + lVar24));
                                  auVar40 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                               ((long)pfVar29 + lVar24));
                                  auVar39 = vfmadd231ps_avx512f(auVar40,auVar38,auVar39);
                                  auVar37 = vcvtps2ph_avx512f(auVar39,0);
                                  *(undefined1 (*) [32])((long)pfVar29 + lVar24) = auVar37;
                                }
                                pfVar29 = pfVar29 + 0x20;
                                lVar20 = lVar20 + 0x80;
                              }
                              puVar30 = (ushort *)((long)pvVar10 + lVar26);
                              for (uVar22 = uVar34; (long)uVar22 < (long)uVar31; uVar22 = uVar22 + 1
                                  ) {
                                uVar4 = *puVar30;
                                puVar30 = puVar30 + 1;
                                auVar36 = vfmadd213ss_fma(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                           (ulong)uVar4 * 4)),
                                                          in_ZMM5._0_16_,
                                                          ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                           (ulong)*(ushort *)
                                                                                   ((long)pfVar1 +
                                                                                   uVar22 * 2) * 4))
                                                         );
                                auVar36 = vcvtps2ph_f16c(auVar36,0);
                                vpextrw_avx(auVar36,0);
                              }
                            }
                            else {
                              if (fVar43 <= fVar42) {
                                auVar47._0_4_ = expf(fVar43 - fVar42);
                                auVar47._4_60_ = extraout_var_01;
                                auVar38 = ZEXT1664(auVar47._0_16_);
                                local_68 = SUB6416(ZEXT464(0x3f800000),0);
                              }
                              else {
                                local_68._0_4_ = expf(fVar42 - fVar43);
                                local_68._4_4_ = extraout_XMM0_Db;
                                local_68._8_4_ = extraout_XMM0_Dc;
                                local_68._12_4_ = extraout_XMM0_Dd;
                                ggml_vec_scale_f32(iVar28,local_200,(float)local_68._0_4_);
                                auVar38 = ZEXT464(0x3f800000);
                                fVar42 = fVar43;
                              }
                              local_1c8 = auVar38._0_16_;
                              pfVar29 = (float *)((long)pvVar10 +
                                                 uVar27 * local_180 + local_90 + local_98);
                              if (local_a0 != (code *)0x0) {
                                (*local_a0)(pfVar29,pfVar1,uVar6);
                                auVar38 = ZEXT1664(local_1c8);
                                pfVar29 = pfVar1;
                              }
                              ggml_vec_mad_f32(iVar28,local_200,pfVar29,auVar38._0_4_);
                              in_ZMM5 = ZEXT1664(local_1c8);
                              iVar33 = local_1e8;
                              auVar44 = local_68;
                            }
                            auVar44 = vfmadd213ss_fma(auVar44,ZEXT416((uint)auVar48._0_4_),
                                                      in_ZMM5._0_16_);
                            auVar48 = ZEXT1664(auVar44);
                          }
                          else {
                            fVar43 = (float)local_1f8 *
                                     *(float *)(&ggml_table_f32_f16 +
                                               (ulong)*(ushort *)((long)local_230 + uVar27 * 2) * 4)
                            ;
                            if (-INFINITY < fVar43) goto LAB_00140c50;
                          }
                          uVar27 = uVar27 + 1;
                          lVar19 = lVar19 + local_180;
                          lVar26 = lVar26 + local_180;
                        }
                        if (v->type == GGML_TYPE_F16) {
                          for (uVar27 = 0; local_88 != uVar27; uVar27 = uVar27 + 1) {
                            local_200[uVar27] =
                                 *(float *)(&ggml_table_f32_f16 +
                                           (ulong)*(ushort *)
                                                   ((long)local_200 + uVar27 * 2 + local_1b8) * 4);
                          }
                        }
                        in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                        ggml_vec_scale_f32(iVar28,local_200,1.0 / auVar48._0_4_);
                        memcpy((void *)(((local_b0 + local_190 * local_1f0) * local_110 + local_b8)
                                        * local_1a8 + (long)local_1b0->data),pfVar29,local_1a8);
                        local_a8 = local_a8 + 1;
                      } while( true );
                    }
                    pcVar23 = 
                    "(v->type == GGML_TYPE_F32 || v_to_float ) && \"fattn: unsupported V-type\"";
                    uVar25 = 0x1b21;
                  }
                }
              }
              else {
                pcVar23 = "nb0 == sizeof(float)";
                uVar25 = 0x1af1;
              }
            }
            else {
              pcVar23 = "neq0 == DK";
              uVar25 = 0x1aea;
            }
          }
          else {
            pcVar23 = "nbv0 == ggml_type_size(v->type)";
            uVar25 = 0x1ae8;
          }
        }
        else {
          pcVar23 = "nbk0 == ggml_type_size(k->type)";
          uVar25 = 0x1ae7;
        }
      }
      else {
        pcVar23 = "nbq0 == ggml_type_size(q->type)";
        uVar25 = 0x1ae6;
      }
    }
    else {
      pcVar23 = "ne2 == N";
      uVar25 = 0x1ae3;
    }
  }
  else {
    pcVar23 = "ne0 == DV";
    uVar25 = 0x1ae2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

void ggml_compute_forward_flash_attn_ext(
        const ggml_compute_params * params,
        const ggml_tensor * q,
        const ggml_tensor * k,
        const ggml_tensor * v,
        const ggml_tensor * mask,
        ggml_tensor * dst) {
    switch (dst->op_params[3]) {
        case GGML_PREC_DEFAULT:
        case GGML_PREC_F32:
            {
                // uses F32 accumulators
                ggml_compute_forward_flash_attn_ext_f16(params, q, k, v, mask, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}